

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choicfmt.cpp
# Opt level: O3

int __thiscall
icu_63::ChoiceFormat::clone
          (ChoiceFormat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ChoiceFormat *this_00;
  
  this_00 = (ChoiceFormat *)UMemory::operator_new((UMemory *)0x1e8,(size_t)__fn);
  if (this_00 != (ChoiceFormat *)0x0) {
    ChoiceFormat(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Format*
ChoiceFormat::clone() const
{
    ChoiceFormat *aCopy = new ChoiceFormat(*this);
    return aCopy;
}